

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStepInnerStepper_AllocVecs(MRIStepInnerStepper stepper,int count,N_Vector tmpl)

{
  int iVar1;
  N_Vector *pp_Var2;
  sunrealtype *psVar3;
  sunindextype liw1;
  sunindextype lrw1;
  sunindextype local_30;
  sunindextype local_28;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    return -0x16;
  }
  if (tmpl->ops->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    local_28 = 0;
    local_30 = 0;
  }
  else {
    N_VSpace(tmpl,&local_28,&local_30);
  }
  stepper->lrw1 = local_28;
  stepper->liw1 = local_30;
  stepper->nforcing = count;
  iVar1 = stepper->nforcing_allocated;
  if (iVar1 < count) {
    if (iVar1 != 0) {
      arkFreeVecArray(iVar1,&stepper->forcing,local_28,&stepper->lrw,local_30,&stepper->liw);
    }
    iVar1 = arkAllocVecArray(stepper->nforcing,tmpl,&stepper->forcing,stepper->lrw1,&stepper->lrw,
                             stepper->liw1,&stepper->liw);
    if (iVar1 == 0) goto LAB_00146ea3;
    stepper->nforcing_allocated = stepper->nforcing;
  }
  if (stepper->vecs == (N_Vector *)0x0) {
    pp_Var2 = (N_Vector *)calloc((long)(count + 1),8);
    stepper->vecs = pp_Var2;
    if (pp_Var2 == (N_Vector *)0x0) goto LAB_00146ea3;
  }
  if (stepper->vals != (sunrealtype *)0x0) {
    return 0;
  }
  psVar3 = (sunrealtype *)calloc((long)(count + 1),8);
  stepper->vals = psVar3;
  if (psVar3 != (sunrealtype *)0x0) {
    return 0;
  }
LAB_00146ea3:
  mriStepInnerStepper_FreeVecs(stepper);
  return -0x14;
}

Assistant:

int mriStepInnerStepper_AllocVecs(MRIStepInnerStepper stepper, int count,
                                  N_Vector tmpl)
{
  sunindextype lrw1, liw1;

  if (stepper == NULL) { return ARK_ILL_INPUT; }

  /* Set space requirements for one N_Vector */
  if (tmpl->ops->nvspace) { N_VSpace(tmpl, &lrw1, &liw1); }
  else
  {
    lrw1 = 0;
    liw1 = 0;
  }
  stepper->lrw1 = lrw1;
  stepper->liw1 = liw1;

  /* Set the number of forcing vectors and allocate vectors */
  stepper->nforcing = count;

  if (stepper->nforcing_allocated < stepper->nforcing)
  {
    if (stepper->nforcing_allocated)
    {
      arkFreeVecArray(stepper->nforcing_allocated, &(stepper->forcing),
                      stepper->lrw1, &(stepper->lrw), stepper->liw1,
                      &(stepper->liw));
    }
    if (!arkAllocVecArray(stepper->nforcing, tmpl, &(stepper->forcing),
                          stepper->lrw1, &(stepper->lrw), stepper->liw1,
                          &(stepper->liw)))
    {
      mriStepInnerStepper_FreeVecs(stepper);
      return (ARK_MEM_FAIL);
    }
    stepper->nforcing_allocated = stepper->nforcing;
  }

  /* Allocate fused operation workspace arrays */
  if (stepper->vecs == NULL)
  {
    stepper->vecs = (N_Vector*)calloc(count + 1, sizeof(*stepper->vecs));
    if (stepper->vecs == NULL)
    {
      mriStepInnerStepper_FreeVecs(stepper);
      return (ARK_MEM_FAIL);
    }
  }

  if (stepper->vals == NULL)
  {
    stepper->vals = (sunrealtype*)calloc(count + 1, sizeof(*stepper->vals));
    if (stepper->vals == NULL)
    {
      mriStepInnerStepper_FreeVecs(stepper);
      return (ARK_MEM_FAIL);
    }
  }

  return (ARK_SUCCESS);
}